

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O1

hash_code __thiscall
llvm::hashing::detail::hash_combine_recursive_helper::
combine<unsigned_char,unsigned_int,short,llvm::hash_code>
          (hash_combine_recursive_helper *this,size_t length,char *buffer_ptr,char *buffer_end,
          uchar *arg,uint *args,short *args_1,hash_code *args_2)

{
  char *pcVar1;
  hash_code hVar2;
  size_t local_40;
  size_t local_38;
  
  local_40 = length;
  pcVar1 = combine_data<unsigned_char>(this,&local_40,buffer_ptr,buffer_end,*arg);
  local_38 = local_40;
  pcVar1 = combine_data<unsigned_int>(this,&local_38,pcVar1,buffer_end,*args);
  hVar2 = combine<short,llvm::hash_code>(this,local_38,pcVar1,buffer_end,args_1,args_2);
  return (hash_code)hVar2.value;
}

Assistant:

hash_code combine(size_t length, char *buffer_ptr, char *buffer_end,
                    const T &arg, const Ts &...args) {
    buffer_ptr = combine_data(length, buffer_ptr, buffer_end, get_hashable_data(arg));

    // Recurse to the next argument.
    return combine(length, buffer_ptr, buffer_end, args...);
  }